

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O2

INTN findPattern(UINT8 *pattern,UINT8 *patternMask,UINTN patternSize,UINT8 *data,UINTN dataSize,
                UINTN dataOff)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  UINT8 *pUVar4;
  UINTN UVar5;
  
  if ((dataOff < dataSize) && (patternSize - 1 < dataSize - dataOff)) {
    pUVar4 = data + dataOff;
    for (; dataOff + patternSize <= dataSize; dataOff = dataOff + 1) {
      UVar5 = 0;
      do {
        if (patternSize == UVar5) {
          return dataOff;
        }
        pbVar1 = patternMask + UVar5;
        pbVar2 = pUVar4 + UVar5;
        pbVar3 = pattern + UVar5;
        UVar5 = UVar5 + 1;
      } while ((*pbVar1 & *pbVar2) == *pbVar3);
      pUVar4 = pUVar4 + 1;
    }
  }
  return -1;
}

Assistant:

INTN findPattern(const UINT8 *pattern, const UINT8 *patternMask, UINTN patternSize,
                 const UINT8 *data, UINTN dataSize, UINTN dataOff)
{
    if (patternSize == 0 || dataSize == 0 || dataOff >= dataSize || dataSize - dataOff < patternSize)
        return -1;
    
    while (dataOff + patternSize <= dataSize) {
        bool matches = true;
        for (UINTN i = 0; i < patternSize; i++) {
            if ((data[dataOff + i] & patternMask[i]) != pattern[i]) {
                matches = false;
                break;
            }
        }
        
        if (matches)
            return static_cast<INTN>(dataOff);
        
        dataOff++;
    }
    
    return -1;
}